

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O0

int cLUWorkInit(int m,int n,int panel_size,int **iworkptr,singlecomplex **dworkptr,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  singlecomplex *psVar5;
  int local_60;
  int local_58;
  int rowblk;
  int maxsuper;
  singlecomplex *old_ptr;
  int extra;
  int dsize;
  int isize;
  GlobalLU_t *Glu_local;
  singlecomplex **dworkptr_local;
  int **iworkptr_local;
  int panel_size_local;
  int n_local;
  int m_local;
  
  iVar1 = sp_ienv(3);
  iVar2 = sp_ienv(7);
  if (iVar2 < iVar1) {
    local_58 = sp_ienv(3);
  }
  else {
    local_58 = sp_ienv(7);
  }
  iVar1 = sp_ienv(4);
  iVar2 = (panel_size * 2 + 5) * m * 4;
  local_60 = m;
  if (m <= (local_58 + iVar1) * panel_size) {
    local_60 = (local_58 + iVar1) * panel_size;
  }
  iVar1 = (m * panel_size + local_60) * 8;
  if (Glu->MemModel == SYSTEM) {
    piVar4 = int32Calloc((int)((ulong)(long)iVar2 >> 2));
    *iworkptr = piVar4;
  }
  else {
    piVar4 = (int *)cuser_malloc(iVar2,1,Glu);
    *iworkptr = piVar4;
  }
  if (*iworkptr == (int *)0x0) {
    fprintf(_stderr,"cLUWorkInit: malloc fails for local iworkptr[]\n");
    n_local = iVar2 + n;
  }
  else {
    if (Glu->MemModel == SYSTEM) {
      psVar5 = (singlecomplex *)superlu_malloc((long)iVar1);
      *dworkptr = psVar5;
    }
    else {
      psVar5 = (singlecomplex *)cuser_malloc(iVar1,1,Glu);
      *dworkptr = psVar5;
      if (((ulong)*dworkptr & 7) != 0) {
        psVar5 = *dworkptr;
        *dworkptr = (singlecomplex *)((ulong)((long)&(*dworkptr)->i + 3U) & 0xfffffffffffffff8);
        *dworkptr = *dworkptr + -1;
        iVar3 = (int)psVar5 - (int)*dworkptr;
        (Glu->stack).top2 = (Glu->stack).top2 - iVar3;
        (Glu->stack).used = iVar3 + (Glu->stack).used;
      }
    }
    if (*dworkptr == (singlecomplex *)0x0) {
      fprintf(_stderr,"malloc fails for local dworkptr[].");
      n_local = iVar2 + iVar1 + n;
    }
    else {
      n_local = 0;
    }
  }
  return n_local;
}

Assistant:

int
cLUWorkInit(int m, int n, int panel_size, int **iworkptr, 
            singlecomplex **dworkptr, GlobalLU_t *Glu)
{
    int    isize, dsize, extra;
    singlecomplex *old_ptr;
    int    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
           rowblk   = sp_ienv(4);

    /* xplore[m] and xprune[n] can be 64-bit; they are allocated separately */
    //isize = ( (2 * panel_size + 3 + NO_MARKER ) * m + n ) * sizeof(int);
    isize = ( (2 * panel_size + 2 + NO_MARKER ) * m ) * sizeof(int);
    dsize = (m * panel_size +
	     NUM_TEMPV(m,panel_size,maxsuper,rowblk)) * sizeof(singlecomplex);
    
    if ( Glu->MemModel == SYSTEM ) 
	*iworkptr = (int *) int32Calloc(isize/sizeof(int));
    else
	*iworkptr = (int *) cuser_malloc(isize, TAIL, Glu);
    if ( ! *iworkptr ) {
	fprintf(stderr, "cLUWorkInit: malloc fails for local iworkptr[]\n");
	return (isize + n);
    }

    if ( Glu->MemModel == SYSTEM )
	*dworkptr = (singlecomplex *) SUPERLU_MALLOC(dsize);
    else {
	*dworkptr = (singlecomplex *) cuser_malloc(dsize, TAIL, Glu);
	if ( NotDoubleAlign(*dworkptr) ) {
	    old_ptr = *dworkptr;
	    *dworkptr = (singlecomplex*) DoubleAlign(*dworkptr);
	    *dworkptr = (singlecomplex*) ((double*)*dworkptr - 1);
	    extra = (char*)old_ptr - (char*)*dworkptr;
#if ( DEBUGlevel>=1 )
	    printf("cLUWorkInit: not aligned, extra %d\n", extra); fflush(stdout);
#endif	    
	    Glu->stack.top2 -= extra;
	    Glu->stack.used += extra;
	}
    }
    if ( ! *dworkptr ) {
	fprintf(stderr, "malloc fails for local dworkptr[].");
	return (isize + dsize + n);
    }
	
    return 0;
}